

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O1

void chrono::utils::WriteBodies
               (ChSystem *system,string *filename,bool active_only,bool dump_vel,string *delim)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  pointer psVar6;
  CSV_writer csv;
  string local_1f0;
  string *local_1d0;
  CSV_writer local_1c8;
  
  local_1d0 = filename;
  CSV_writer::CSV_writer(&local_1c8,delim);
  psVar6 = (system->assembly).bodylist.
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (system->assembly).bodylist.
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar1) {
    do {
      peVar2 = (psVar6->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this = (psVar6->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      if (active_only) {
        iVar4 = (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])(peVar2);
        if ((char)iVar4 != '\0') goto LAB_009460f9;
      }
      else {
LAB_009460f9:
        poVar5 = std::ostream::_M_insert<double>
                           ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.
                            super_ChFrame<double>.coord.pos.m_data[0]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
        poVar5 = std::ostream::_M_insert<double>
                           ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.
                            super_ChFrame<double>.coord.pos.m_data[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
        poVar5 = std::ostream::_M_insert<double>
                           ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.
                            super_ChFrame<double>.coord.pos.m_data[2]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
        poVar5 = std::ostream::_M_insert<double>
                           ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.
                            super_ChFrame<double>.coord.rot.m_data[0]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
        poVar5 = std::ostream::_M_insert<double>
                           ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.
                            super_ChFrame<double>.coord.rot.m_data[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
        poVar5 = std::ostream::_M_insert<double>
                           ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.
                            super_ChFrame<double>.coord.rot.m_data[2]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
        poVar5 = std::ostream::_M_insert<double>
                           ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.
                            super_ChFrame<double>.coord.rot.m_data[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
        if (dump_vel) {
          poVar5 = std::ostream::_M_insert<double>
                             ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.
                              m_data[0]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
          poVar5 = std::ostream::_M_insert<double>
                             ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.
                              m_data[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
          poVar5 = std::ostream::_M_insert<double>
                             ((peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.
                              m_data[2]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
          ChFrameMoving<double>::GetWvel_loc
                    (&(peVar2->super_ChBodyFrame).super_ChFrameMoving<double>);
          poVar5 = std::ostream::_M_insert<double>((double)local_1f0._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
          poVar5 = std::ostream::_M_insert<double>((double)local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
          poVar5 = std::ostream::_M_insert<double>((double)local_1f0.field_2._M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
        }
        cVar3 = (char)&local_1c8.m_ss;
        std::ios::widen((char)*(undefined8 *)(local_1c8._32_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar1);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  CSV_writer::write_to_file(&local_1c8,local_1d0,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  CSV_writer::~CSV_writer(&local_1c8);
  return;
}

Assistant:

void WriteBodies(ChSystem* system,
                 const std::string& filename,
                 bool active_only,
                 bool dump_vel,
                 const std::string& delim) {
    CSV_writer csv(delim);

    for (auto body : system->Get_bodylist()) {
        if (active_only && !body->IsActive())
            continue;
        csv << body->GetPos() << body->GetRot();
        if (dump_vel)
            csv << body->GetPos_dt() << body->GetWvel_loc();
        csv << std::endl;
    }

    csv.write_to_file(filename);
}